

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_ab4fe2::TestPresetOptionalFilterIncludeIndexHelper
          (optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out,Value *value
          )

{
  bool bVar1;
  IndexOptions *pIVar2;
  String local_48;
  Value *local_20;
  Value *value_local;
  optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out_local;
  
  local_20 = value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::operator=(out);
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::emplace<>
                ((optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *)
                 value_local);
      Json::Value::asString_abi_cxx11_(&local_48,local_20);
      pIVar2 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
               operator->((optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *
                          )value_local);
      std::__cxx11::string::operator=((string *)&pIVar2->IndexFile,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      out_local._4_4_ = READ_OK;
    }
    else {
      bVar1 = Json::Value::isObject(local_20);
      if (bVar1) {
        out_local._4_4_ =
             std::
             function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*)>
             ::operator()((function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*)>
                           *)(anonymous_namespace)::TestPresetOptionalFilterIncludeIndexObjectHelper
                          ,(optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            *)value_local,local_20);
      }
      else {
        out_local._4_4_ = INVALID_PRESET;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult TestPresetOptionalFilterIncludeIndexHelper(
  cm::optional<TestPreset::IncludeOptions::IndexOptions>& out,
  const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (value->isString()) {
    out.emplace();
    out->IndexFile = value->asString();
    return ReadFileResult::READ_OK;
  }

  if (value->isObject()) {
    return TestPresetOptionalFilterIncludeIndexObjectHelper(out, value);
  }

  return ReadFileResult::INVALID_PRESET;
}